

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_Material::Write(ON_Material *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ON__UINT32 i_00;
  ON_Texture *o;
  uint local_44;
  uint i;
  uint count;
  bool textures_chunk_rc;
  int textures_minor_version;
  int textures_major_version;
  uint attributes_filter;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_Material *this_local;
  
  iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar3 < 0x3c) {
    this_local._7_1_ = Internal_WriteV5(this,archive);
  }
  else {
    bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
    if (bVar1) {
      this_local._7_1_ = false;
      bVar1 = ON_ModelComponent::WriteModelComponentAttributes
                        (&this->super_ON_ModelComponent,archive,0x38);
      if ((((((bVar1) && (bVar1 = ON_BinaryArchive::WriteUuid(archive,&this->m_plugin_id), bVar1))
            && (bVar1 = ON_BinaryArchive::WriteColor(archive,&this->m_ambient), bVar1)) &&
           (((bVar1 = ON_BinaryArchive::WriteColor(archive,&this->m_diffuse), bVar1 &&
             (bVar1 = ON_BinaryArchive::WriteColor(archive,&this->m_emission), bVar1)) &&
            ((bVar1 = ON_BinaryArchive::WriteColor(archive,&this->m_specular), bVar1 &&
             ((bVar1 = ON_BinaryArchive::WriteColor(archive,&this->m_reflection), bVar1 &&
              (bVar1 = ON_BinaryArchive::WriteColor(archive,&this->m_transparent), bVar1)))))))) &&
          ((bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_index_of_refraction), bVar1 &&
           (((bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_reflectivity), bVar1 &&
             (bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_shine), bVar1)) &&
            (bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_transparency), bVar1)))))) &&
         (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0), bVar1)) {
        bVar1 = false;
        i_00 = ON_ClassArray<ON_Texture>::Count(&(this->m_textures).super_ON_ClassArray<ON_Texture>)
        ;
        bVar2 = ON_BinaryArchive::WriteInt(archive,i_00);
        if (bVar2) {
          for (local_44 = 0; local_44 < i_00; local_44 = local_44 + 1) {
            o = ON_ClassArray<ON_Texture>::operator[]
                          (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_44);
            bVar2 = ON_BinaryArchive::WriteObject(archive,&o->super_ON_Object);
            if (!bVar2) break;
          }
          if (i_00 <= local_44) {
            bVar1 = true;
          }
        }
        bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
        if (!bVar2) {
          bVar1 = false;
        }
        if ((((bVar1) &&
             (bVar1 = ON_BinaryArchive::WriteArray(archive,&this->m_material_channel), bVar1)) &&
            (((bVar1 = ON_BinaryArchive::WriteBool(archive,(bool)(this->m_bShareable & 1)), bVar1 &&
              ((bVar1 = ON_BinaryArchive::WriteBool(archive,(bool)(this->m_bDisableLighting & 1)),
               bVar1 && (bVar1 = ON_BinaryArchive::WriteBool
                                           (archive,(bool)(this->m_bFresnelReflections & 1)), bVar1)
               ))) && (bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_reflection_glossiness),
                      bVar1)))) &&
           ((((bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_refraction_glossiness), bVar1
              && (bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_fresnel_index_of_refraction)
                 , bVar1)) &&
             (bVar1 = ON_BinaryArchive::WriteUuid(archive,&this->m_rdk_material_instance_id), bVar1)
             ) && (bVar1 = ON_BinaryArchive::WriteBool
                                     (archive,(bool)(this->
                                                  m_bUseDiffuseTextureAlphaForObjectTransparencyTexture
                                                  & 1)), bVar1)))) {
          this_local._7_1_ = true;
        }
      }
      bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
      if (!bVar1) {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Material::Write( ON_BinaryArchive& archive ) const
{
  if (archive.Archive3dmVersion() < 60)
    return Internal_WriteV5(archive);

  const int major_version = 1;
  const int minor_version = 0;
  if (!archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,major_version,minor_version))
    return false;

  bool rc = false;
  for (;;)
  {
    const unsigned int attributes_filter
      = ON_ModelComponent::Attributes::IndexAttribute
      | ON_ModelComponent::Attributes::IdAttribute
      | ON_ModelComponent::Attributes::NameAttribute;
    if ( !WriteModelComponentAttributes(archive,attributes_filter)) break;

    if ( !archive.WriteUuid(m_plugin_id) ) break;

    if ( !archive.WriteColor( m_ambient ) ) break;
    if ( !archive.WriteColor( m_diffuse ) ) break;
    if ( !archive.WriteColor( m_emission ) ) break;
    if ( !archive.WriteColor( m_specular ) ) break;
    if ( !archive.WriteColor( m_reflection ) ) break;
    if ( !archive.WriteColor( m_transparent ) ) break;

    if ( !archive.WriteDouble( m_index_of_refraction ) ) break;
    if ( !archive.WriteDouble( m_reflectivity ) ) break;
    if ( !archive.WriteDouble( m_shine ) ) break;
    if (!archive.WriteDouble(m_transparency)) break;

    // array of textures written in a way that user data persists
    {
      const int textures_major_version = 1;
      const int textures_minor_version = 0;
      if (!archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK, textures_major_version, textures_minor_version))
        break;
      bool textures_chunk_rc = false;
      for (;;)
      {
        const unsigned int count = m_textures.Count();
        if (!archive.WriteInt(count))
          break;
        unsigned int i;
        for (i = 0; i < count; i++)
        {
          if (!archive.WriteObject(&m_textures[i]))
            break;
        }
        if (i < count)
          break;
        textures_chunk_rc = true;
        break;
      }
      if (!archive.EndWrite3dmChunk())
        textures_chunk_rc = false;
      if ( !textures_chunk_rc )
        break;
    }

    if ( !archive.WriteArray(m_material_channel) )
      break;
    if ( !archive.WriteBool(m_bShareable) )
      break;
    if ( !archive.WriteBool(m_bDisableLighting))
      break;
    if ( !archive.WriteBool(m_bFresnelReflections))
      break;
    if ( !archive.WriteDouble(m_reflection_glossiness))
      break;
    if ( !archive.WriteDouble(m_refraction_glossiness))
      break;
    if ( !archive.WriteDouble(m_fresnel_index_of_refraction))
      break;
    if ( !archive.WriteUuid(m_rdk_material_instance_id))
      break;
    if ( !archive.WriteBool(m_bUseDiffuseTextureAlphaForObjectTransparencyTexture))
      break;

    rc = true;
    break;
  }

  if (!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}